

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O0

Vec_Int_t * Llb_ManCollectHighFanoutObjects(Aig_Man_t *pAig,int nCandMax,int fCisOnly)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Aig_Obj_t *pAVar6;
  int Temp;
  int PivotValue;
  int fChanges;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vResult;
  Vec_Int_t *vFanouts;
  int fCisOnly_local;
  int nCandMax_local;
  Aig_Man_t *pAig_local;
  
  pVVar5 = Vec_IntAlloc(100);
  for (PivotValue = 0; iVar2 = Vec_PtrSize(pAig->vObjs), PivotValue < iVar2;
      PivotValue = PivotValue + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,PivotValue);
    if ((pAVar6 != (Aig_Obj_t *)0x0) &&
       ((iVar2 = Saig_ObjIsLo(pAig,pAVar6), iVar2 != 0 ||
        ((fCisOnly == 0 && (iVar2 = Aig_ObjIsNode(pAVar6), iVar2 != 0)))))) {
      iVar2 = Aig_ObjRefs(pAVar6);
      Vec_IntPush(pVVar5,iVar2);
    }
  }
  Vec_IntSort(pVVar5,1);
  iVar2 = Vec_IntSize(pVVar5);
  iVar2 = Abc_MinInt(nCandMax,iVar2 + -1);
  iVar3 = Vec_IntEntry(pVVar5,iVar2);
  Vec_IntFree(pVVar5);
  pVVar5 = Vec_IntAlloc(100);
  for (PivotValue = 0; iVar4 = Vec_PtrSize(pAig->vObjs), PivotValue < iVar4;
      PivotValue = PivotValue + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,PivotValue);
    if ((pAVar6 != (Aig_Obj_t *)0x0) &&
       (((iVar4 = Saig_ObjIsLo(pAig,pAVar6), iVar4 != 0 ||
         ((fCisOnly == 0 && (iVar4 = Aig_ObjIsNode(pAVar6), iVar4 != 0)))) &&
        (iVar4 = Aig_ObjRefs(pAVar6), iVar3 <= iVar4)))) {
      iVar4 = Aig_ObjId(pAVar6);
      Vec_IntPush(pVVar5,iVar4);
    }
  }
  iVar3 = Vec_IntSize(pVVar5);
  if (iVar2 <= iVar3) {
    do {
      bVar1 = false;
      for (PivotValue = 0; iVar2 = Vec_IntSize(pVVar5), PivotValue < iVar2 + -1;
          PivotValue = PivotValue + 1) {
        iVar2 = Vec_IntEntry(pVVar5,PivotValue);
        pAVar6 = Aig_ManObj(pAig,iVar2);
        iVar2 = Aig_ObjRefs(pAVar6);
        iVar3 = Vec_IntEntry(pVVar5,PivotValue + 1);
        pAVar6 = Aig_ManObj(pAig,iVar3);
        iVar3 = Aig_ObjRefs(pAVar6);
        if (iVar2 < iVar3) {
          iVar2 = Vec_IntEntry(pVVar5,PivotValue);
          iVar3 = Vec_IntEntry(pVVar5,PivotValue + 1);
          Vec_IntWriteEntry(pVVar5,PivotValue,iVar3);
          Vec_IntWriteEntry(pVVar5,PivotValue + 1,iVar2);
          bVar1 = true;
        }
      }
    } while (bVar1);
    return pVVar5;
  }
  __assert_fail("Vec_IntSize(vResult) >= nCandMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Hint.c"
                ,0x7f,"Vec_Int_t *Llb_ManCollectHighFanoutObjects(Aig_Man_t *, int, int)");
}

Assistant:

Vec_Int_t * Llb_ManCollectHighFanoutObjects( Aig_Man_t * pAig, int nCandMax, int fCisOnly )
{
    Vec_Int_t * vFanouts, * vResult;
    Aig_Obj_t * pObj; 
    int i, fChanges, PivotValue;
//    int Entry;
    // collect fanout counts
    vFanouts = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( !Aig_ObjIsCi(pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
        if ( !Saig_ObjIsLo(pAig,pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
            continue;
        Vec_IntPush( vFanouts, Aig_ObjRefs(pObj) );
    }
    Vec_IntSort( vFanouts, 1 );
    // pick the separator
    nCandMax = Abc_MinInt( nCandMax, Vec_IntSize(vFanouts) - 1 );
    PivotValue = Vec_IntEntry( vFanouts, nCandMax );
    Vec_IntFree( vFanouts );
    // collect obj satisfying the constraints
    vResult = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        if ( !Aig_ObjIsCi(pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
        if ( !Saig_ObjIsLo(pAig,pObj) && (fCisOnly || !Aig_ObjIsNode(pObj)) )
            continue;
        if ( Aig_ObjRefs(pObj) < PivotValue )
            continue;
        Vec_IntPush( vResult, Aig_ObjId(pObj) );
    }
    assert( Vec_IntSize(vResult) >= nCandMax );
    // order in the decreasing order of fanouts
    do
    {
        fChanges = 0;
        for ( i = 0; i < Vec_IntSize(vResult) - 1; i++ )
            if ( Aig_ObjRefs(Aig_ManObj(pAig, Vec_IntEntry(vResult, i))) < 
                 Aig_ObjRefs(Aig_ManObj(pAig, Vec_IntEntry(vResult, i+1))) )
            {
                int Temp = Vec_IntEntry( vResult, i );
                Vec_IntWriteEntry( vResult, i, Vec_IntEntry(vResult, i+1) );
                Vec_IntWriteEntry( vResult, i+1, Temp );
                fChanges = 1;
            }
    }
    while ( fChanges );
/*
    Vec_IntForEachEntry( vResult, Entry, i )
        printf( "%d ", Aig_ObjRefs(Aig_ManObj(pAig, Entry)) );
printf( "\n" );
*/
    return vResult;
}